

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_pa_buffer_attr *
ma_device__pa_buffer_attr_new
          (ma_pa_buffer_attr *__return_storage_ptr__,ma_uint32 periodSizeInFrames,ma_uint32 periods,
          ma_pa_sample_spec *ss)

{
  byte bVar1;
  ma_format format;
  ma_uint32 mVar2;
  ma_pa_buffer_attr *attr;
  ma_pa_sample_spec *ss_local;
  ma_uint32 periods_local;
  ma_uint32 periodSizeInFrames_local;
  
  format = ma_format_from_pulse(ss->format);
  bVar1 = ss->channels;
  mVar2 = ma_get_bytes_per_sample(format);
  __return_storage_ptr__->maxlength = periodSizeInFrames * periods * mVar2 * bVar1;
  __return_storage_ptr__->tlength = __return_storage_ptr__->maxlength / periods;
  __return_storage_ptr__->prebuf = 0xffffffff;
  __return_storage_ptr__->minreq = 0xffffffff;
  __return_storage_ptr__->fragsize = __return_storage_ptr__->maxlength / periods;
  return __return_storage_ptr__;
}

Assistant:

static ma_pa_buffer_attr ma_device__pa_buffer_attr_new(ma_uint32 periodSizeInFrames, ma_uint32 periods, const ma_pa_sample_spec* ss)
{
    ma_pa_buffer_attr attr;
    attr.maxlength = periodSizeInFrames * periods * ma_get_bytes_per_frame(ma_format_from_pulse(ss->format), ss->channels);
    attr.tlength   = attr.maxlength / periods;
    attr.prebuf    = (ma_uint32)-1;
    attr.minreq    = (ma_uint32)-1;
    attr.fragsize  = attr.maxlength / periods;

    return attr;
}